

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O0

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genStructField
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Field field,Schema scope,
          Indent indent)

{
  int *piVar1;
  Reader type;
  Reader type_00;
  Reader value;
  Reader value_00;
  Reader list;
  Reader list_00;
  Schema schema;
  bool bVar2;
  Which WVar3;
  uint32_t uVar4;
  Indent indent_00;
  anon_union_8_2_eba6ea51_for_Type_5 params_1;
  unsigned_short *puVar5;
  char (*params) [1];
  char (*in_R8) [2];
  char (*params_9) [3];
  char (*in_stack_fffffffffffffac0) [2];
  Array<kj::StringTree> local_4a0;
  uint16_t local_482;
  StringTree local_480;
  RawBrandedSchema *local_448;
  undefined1 local_440 [48];
  StringTree local_410;
  ArrayPtr<const_char> local_3d8;
  Type local_3c8;
  Schema local_3b8;
  StructSchema group;
  StringTree local_3a8;
  int local_36c;
  int local_368;
  uint32_t local_364;
  StringTree local_360;
  RawBrandedSchema *local_328;
  Reader local_320;
  StringTree local_2f0;
  byte local_2b1;
  Reader local_2b0;
  Type local_280;
  StringTree local_270;
  Reader local_238;
  StringTree local_208;
  Maybe<capnp::InterfaceSchema::Method> local_1c0;
  Schema local_178;
  Reader local_170;
  StringTree local_140;
  Reader local_108;
  uint16_t local_d2;
  ArrayPtr<const_char> local_d0;
  Reader local_c0;
  int local_8c;
  undefined1 local_88 [4];
  int size;
  Reader slot;
  Reader proto;
  CapnpcCapnpMain *this_local;
  Schema SStack_18;
  Indent indent_local;
  Schema scope_local;
  
  piVar1 = &slot._reader.nestingLimit;
  this_local._4_4_ = indent.amount;
  SStack_18.raw = scope.raw;
  StructSchema::Field::getProto((Reader *)piVar1,&field);
  WVar3 = capnp::schema::Field::Reader::which((Reader *)piVar1);
  puVar5 = (unsigned_short *)(ulong)WVar3;
  if (WVar3 == SLOT) {
    piVar1 = &slot._reader.nestingLimit;
    capnp::schema::Field::Reader::getSlot((Reader *)local_88,(Reader *)piVar1);
    capnp::schema::Field::Slot::Reader::getType(&local_c0,(Reader *)local_88);
    type._reader.capTable = local_c0._reader.capTable;
    type._reader.segment = local_c0._reader.segment;
    type._reader.data = local_c0._reader.data;
    type._reader.pointers = local_c0._reader.pointers;
    type._reader.dataSize = local_c0._reader.dataSize;
    type._reader.pointerCount = local_c0._reader.pointerCount;
    type._reader._38_2_ = local_c0._reader._38_2_;
    type._reader.nestingLimit = local_c0._reader.nestingLimit;
    type._reader._44_4_ = local_c0._reader._44_4_;
    local_8c = typeSizeBits(this,type);
    local_d0 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)piVar1);
    capnp::schema::Field::Reader::getOrdinal(&local_108,(Reader *)piVar1);
    local_d2 = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_108);
    capnp::schema::Field::Slot::Reader::getType(&local_170,(Reader *)local_88);
    local_178.raw = SStack_18.raw;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_1c0,(void *)0x0);
    type_00._reader.capTable = local_170._reader.capTable;
    type_00._reader.segment = local_170._reader.segment;
    type_00._reader.data = local_170._reader.data;
    type_00._reader.pointers = local_170._reader.pointers;
    type_00._reader.dataSize = local_170._reader.dataSize;
    type_00._reader.pointerCount = local_170._reader.pointerCount;
    type_00._reader._38_2_ = local_170._reader._38_2_;
    type_00._reader.nestingLimit = local_170._reader.nestingLimit;
    type_00._reader._44_4_ = local_170._reader._44_4_;
    genType(&local_140,this,type_00,local_178,&local_1c0);
    local_2b1 = 0;
    capnp::schema::Field::Slot::Reader::getDefaultValue(&local_238,(Reader *)local_88);
    value._reader.capTable = local_238._reader.capTable;
    value._reader.segment = local_238._reader.segment;
    value._reader.data = local_238._reader.data;
    value._reader.pointers = local_238._reader.pointers;
    value._reader.dataSize = local_238._reader.dataSize;
    value._reader.pointerCount = local_238._reader.pointerCount;
    value._reader._38_2_ = local_238._reader._38_2_;
    value._reader.nestingLimit = local_238._reader.nestingLimit;
    value._reader._44_4_ = local_238._reader._44_4_;
    bVar2 = isEmptyValue(this,value);
    if (bVar2) {
      kj::strTree<char_const(&)[1]>(&local_208,(kj *)0x2932ff,params);
    }
    else {
      local_280 = StructSchema::Field::getType(&field);
      capnp::schema::Field::Slot::Reader::getDefaultValue(&local_2b0,(Reader *)local_88);
      value_00._reader.capTable = local_2b0._reader.capTable;
      value_00._reader.segment = local_2b0._reader.segment;
      value_00._reader.data = local_2b0._reader.data;
      value_00._reader.pointers = local_2b0._reader.pointers;
      value_00._reader.dataSize = local_2b0._reader.dataSize;
      value_00._reader.pointerCount = local_2b0._reader.pointerCount;
      value_00._reader._38_2_ = local_2b0._reader._38_2_;
      value_00._reader.nestingLimit = local_2b0._reader.nestingLimit;
      value_00._reader._44_4_ = local_2b0._reader._44_4_;
      params_1.scopeId = local_280.field_4.scopeId;
      genValue(&local_270,this,local_280,value_00);
      local_2b1 = 1;
      kj::strTree<char_const(&)[4],kj::StringTree>
                (&local_208,(kj *)0x281137,(char (*) [4])&local_270,(StringTree *)params_1.schema);
    }
    capnp::schema::Field::Reader::getAnnotations(&local_320,(Reader *)&slot._reader.nestingLimit);
    local_328 = SStack_18.raw;
    list.reader.capTable = local_320.reader.capTable;
    list.reader.segment = local_320.reader.segment;
    list.reader.ptr = local_320.reader.ptr;
    list.reader.elementCount = local_320.reader.elementCount;
    list.reader.step = local_320.reader.step;
    list.reader.structDataSize = local_320.reader.structDataSize;
    list.reader.structPointerCount = local_320.reader.structPointerCount;
    list.reader.elementSize = local_320.reader.elementSize;
    list.reader._39_1_ = local_320.reader._39_1_;
    list.reader.nestingLimit = local_320.reader.nestingLimit;
    list.reader._44_4_ = local_320.reader._44_4_;
    genAnnotations(&local_2f0,this,list,SStack_18);
    if (local_8c == -1) {
      local_364 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_88);
      puVar5 = (unsigned_short *)0x28d469;
      kj::strTree<char_const(&)[5],unsigned_int,char_const(&)[2]>
                (&local_360,(kj *)"ptr[",(char (*) [5])&local_364,(uint *)0x28d469,in_R8);
    }
    else {
      uVar4 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_88);
      local_368 = uVar4 * local_8c;
      uVar4 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_88);
      local_36c = (uVar4 + 1) * local_8c;
      puVar5 = (unsigned_short *)0x28103d;
      kj::strTree<char_const(&)[6],unsigned_int,char_const(&)[3],unsigned_int,char_const(&)[2]>
                (&local_360,(kj *)"bits[",(char (*) [6])&local_368,(uint *)0x28103d,
                 (char (*) [3])&local_36c,(uint *)0x28e38c,(char (*) [2])local_320.reader.segment);
    }
    bVar2 = hasDiscriminantValue((Reader *)&slot._reader.nestingLimit);
    if (bVar2) {
      group.super_Schema.raw._6_2_ =
           capnp::schema::Field::Reader::getDiscriminantValue((Reader *)&slot._reader.nestingLimit);
      kj::strTree<char_const(&)[15],unsigned_short>
                (&local_3a8,(kj *)", union tag = ",
                 (char (*) [15])((long)&group.super_Schema.raw + 6),puVar5);
    }
    else {
      kj::strTree<>();
    }
    kj::
    strTree<capnp::(anonymous_namespace)::Indent&,capnp::Text::Reader,char_const(&)[3],unsigned_short,char_const(&)[3],kj::StringTree,kj::StringTree,kj::StringTree,char_const(&)[6],kj::StringTree,kj::StringTree,char_const(&)[2]>
              (__return_storage_ptr__,(kj *)((long)&this_local + 4),(Indent *)&local_d0,
               (Reader *)" @",(char (*) [3])&local_d2,(unsigned_short *)0x28108c,
               (char (*) [3])&local_140,&local_208,&local_2f0,(StringTree *)";  # ",
               (char (*) [6])&local_360,&local_3a8,(StringTree *)0x2932fe,in_stack_fffffffffffffac0)
    ;
    kj::StringTree::~StringTree(&local_3a8);
    kj::StringTree::~StringTree(&local_360);
    kj::StringTree::~StringTree(&local_2f0);
    kj::StringTree::~StringTree(&local_208);
    if ((local_2b1 & 1) != 0) {
      kj::StringTree::~StringTree(&local_270);
    }
    kj::StringTree::~StringTree(&local_140);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_1c0);
  }
  else if (WVar3 == GROUP) {
    local_3c8 = StructSchema::Field::getType(&field);
    local_3b8.raw = (RawBrandedSchema *)capnp::Type::asStruct(&local_3c8);
    piVar1 = &slot._reader.nestingLimit;
    local_3d8 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)piVar1);
    capnp::schema::Field::Reader::getAnnotations((Reader *)local_440,(Reader *)piVar1);
    local_448 = SStack_18.raw;
    list_00.reader.capTable = (CapTableReader *)local_440._8_8_;
    list_00.reader.segment = (SegmentReader *)local_440._0_8_;
    list_00.reader.ptr = (byte *)local_440._16_8_;
    list_00.reader.elementCount = local_440._24_4_;
    list_00.reader.step = local_440._28_4_;
    list_00.reader.structDataSize = local_440._32_4_;
    list_00.reader.structPointerCount = local_440._36_2_;
    list_00.reader.elementSize = local_440[0x26];
    list_00.reader._39_1_ = local_440[0x27];
    list_00.reader._40_8_ = local_440._40_8_;
    genAnnotations(&local_410,this,list_00,SStack_18);
    bVar2 = hasDiscriminantValue((Reader *)piVar1);
    if (bVar2) {
      local_482 = capnp::schema::Field::Reader::getDiscriminantValue
                            ((Reader *)&slot._reader.nestingLimit);
      kj::strTree<char_const(&)[17],unsigned_short>
                (&local_480,(kj *)"  # union tag = ",(char (*) [17])&local_482,puVar5);
      params_9 = (char (*) [3])local_440._40_8_;
    }
    else {
      kj::strTree<>();
      params_9 = (char (*) [3])local_440._40_8_;
    }
    schema.raw = local_3b8.raw;
    indent_00 = Indent::next((Indent *)((long)&this_local + 4));
    genStructFields(&local_4a0,this,(StructSchema)schema.raw,indent_00);
    kj::
    strTree<capnp::(anonymous_namespace)::Indent&,capnp::Text::Reader,char_const(&)[8],kj::StringTree,char_const(&)[3],kj::StringTree,char_const(&)[2],kj::Array<kj::StringTree>,capnp::(anonymous_namespace)::Indent&,char_const(&)[3]>
              (__return_storage_ptr__,(kj *)((long)&this_local + 4),(Indent *)&local_3d8,
               (Reader *)" :group",(char (*) [8])&local_410,(StringTree *)" {",
               (char (*) [3])&local_480,(StringTree *)0x2932fe,(char (*) [2])&local_4a0,
               (Array<kj::StringTree> *)((long)&this_local + 4),(Indent *)"}\n",params_9);
    kj::Array<kj::StringTree>::~Array(&local_4a0);
    kj::StringTree::~StringTree(&local_480);
    kj::StringTree::~StringTree(&local_410);
  }
  else {
    kj::strTree<>();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree genStructField(StructSchema::Field field, Schema scope, Indent indent) {
    auto proto = field.getProto();
    switch (proto.which()) {
      case schema::Field::SLOT: {
        auto slot = proto.getSlot();
        int size = typeSizeBits(slot.getType());
        return kj::strTree(
            indent, proto.getName(), " @", proto.getOrdinal().getExplicit(),
            " :", genType(slot.getType(), scope, nullptr),
            isEmptyValue(slot.getDefaultValue()) ? kj::strTree("") :
                kj::strTree(" = ", genValue(field.getType(), slot.getDefaultValue())),
            genAnnotations(proto.getAnnotations(), scope),
            ";  # ", size == -1 ? kj::strTree("ptr[", slot.getOffset(), "]")
                                : kj::strTree("bits[", slot.getOffset() * size, ", ",
                                              (slot.getOffset() + 1) * size, ")"),
            hasDiscriminantValue(proto)
                ? kj::strTree(", union tag = ", proto.getDiscriminantValue()) : kj::strTree(),
            "\n");
      }
      case schema::Field::GROUP: {
        auto group = field.getType().asStruct();
        return kj::strTree(
            indent, proto.getName(),
            " :group", genAnnotations(proto.getAnnotations(), scope), " {",
            hasDiscriminantValue(proto)
                ? kj::strTree("  # union tag = ", proto.getDiscriminantValue()) : kj::strTree(),
            "\n",
            genStructFields(group, indent.next()),
            indent, "}\n");
      }
    }
    return kj::strTree();
  }